

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalInterfaceExamples.cpp
# Opt level: O0

void readGZ1(char *fileName,Array2D<Imath_3_2::half> *rPixels,Array2D<Imath_3_2::half> *gPixels,
            Array2D<float> *zPixels,int *width,int *height)

{
  int iVar1;
  half *phVar2;
  float *pfVar3;
  ulong uVar4;
  _Base_ptr in_RCX;
  Array2D<Imath_3_2::half> *in_RDX;
  Array2D<Imath_3_2::half> *in_RSI;
  char *in_RDI;
  _Base_ptr in_R8;
  _Base_ptr in_R9;
  float fVar5;
  FrameBuffer frameBuffer;
  Box2i dw;
  InputFile file;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  long in_stack_fffffffffffffe80;
  long in_stack_fffffffffffffe88;
  Array2D<Imath_3_2::half> *in_stack_fffffffffffffe90;
  Slice local_138 [56];
  Slice local_100 [56];
  Slice local_c8 [56];
  char local_90 [64];
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  FrameBuffer local_40;
  Array2D<Imath_3_2::half> *local_10;
  
  local_40._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = in_R9;
  local_40._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = in_R8;
  local_40._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = in_RCX;
  local_40._map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)in_RDX;
  local_10 = in_RSI;
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::InputFile::InputFile((InputFile *)&local_40,in_RDI,iVar1);
  Imf_3_2::InputFile::header();
  Imf_3_2::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  (local_40._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->_M_color =
       (local_48 - local_50) + _S_black;
  (local_40._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_color =
       (local_44 - local_4c) + _S_black;
  Imf_3_2::Array2D<Imath_3_2::half>::resizeErase
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  Imf_3_2::Array2D<Imath_3_2::half>::resizeErase
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  Imf_3_2::Array2D<float>::resizeErase
            ((Array2D<float> *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             in_stack_fffffffffffffe80);
  Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x108c9a);
  phVar2 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](local_10,0);
  Imf_3_2::Slice::Slice
            (local_c8,HALF,
             (char *)(phVar2 + (-(long)local_50 -
                               (long)(int)(local_4c *
                                          (local_40._map._M_t._M_impl.super__Rb_tree_header.
                                           _M_header._M_left)->_M_color))),2,
             (long)(int)(local_40._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->
                        _M_color * 2,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert(local_90,(Slice *)"R");
  phVar2 = Imf_3_2::Array2D<Imath_3_2::half>::operator[]
                     ((Array2D<Imath_3_2::half> *)
                      local_40._map._M_t._M_impl.super__Rb_tree_header._M_node_count,0);
  Imf_3_2::Slice::Slice
            (local_100,HALF,
             (char *)(phVar2 + (-(long)local_50 -
                               (long)(int)(local_4c *
                                          (local_40._map._M_t._M_impl.super__Rb_tree_header.
                                           _M_header._M_left)->_M_color))),2,
             (long)(int)(local_40._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->
                        _M_color * 2,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert(local_90,(Slice *)"G");
  pfVar3 = Imf_3_2::Array2D<float>::operator[]
                     ((Array2D<float> *)
                      local_40._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right,0);
  pfVar3 = pfVar3 + (-(long)local_50 -
                    (long)(int)(local_4c *
                               (local_40._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
                               ->_M_color));
  uVar4 = (long)(int)(local_40._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->_M_color
          << 2;
  fVar5 = std::numeric_limits<float>::max();
  Imf_3_2::Slice::Slice(local_138,FLOAT,(char *)pfVar3,4,uVar4,1,1,(double)fVar5,false,false);
  Imf_3_2::FrameBuffer::insert(local_90,(Slice *)"Z");
  Imf_3_2::InputFile::setFrameBuffer(&local_40);
  Imf_3_2::InputFile::readPixels((int)&local_40,local_4c);
  Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x108edd);
  Imf_3_2::InputFile::~InputFile((InputFile *)&local_40);
  return;
}

Assistant:

void
readGZ1 (
    const char      fileName[],
    Array2D<half>&  rPixels,
    Array2D<half>&  gPixels,
    Array2D<float>& zPixels,
    int&            width,
    int&            height)
{
    //
    // Read an image using class InputFile.  Try to read two
    // channels, R and G, of type HALF, and one channel, Z,
    // of type FLOAT.  Store the R, G, and Z pixels in three
    // separate memory buffers.
    // If a channel is missing in the file, the buffer for that
    // channel will be filled with an appropriate default value.
    //
    //	- open the file
    //	- allocate memory for the pixels
    //	- describe the layout of the R, G, and Z pixel buffers
    //	- read the pixels from the file
    //

    InputFile file (fileName);

    Box2i dw = file.header ().dataWindow ();
    width    = dw.max.x - dw.min.x + 1;
    height   = dw.max.y - dw.min.y + 1;

    rPixels.resizeErase (height, width);
    gPixels.resizeErase (height, width);
    zPixels.resizeErase (height, width);

    FrameBuffer frameBuffer;

    frameBuffer.insert ("R",					// name
			Slice (IMF::HALF,			// type
			       (char *) (&rPixels[0][0] -	// base
					 dw.min.x -
					 dw.min.y * width),
			       sizeof (rPixels[0][0]) * 1,	// xStride
			       sizeof (rPixels[0][0]) * width,	// yStride
			       1, 1,				// x/y sampling
			       0.0));				// fillValue

    frameBuffer.insert ("G",					// name
			Slice (IMF::HALF,			// type
			       (char *) (&gPixels[0][0] -	// base
					 dw.min.x -
					 dw.min.y * width),
			       sizeof (gPixels[0][0]) * 1,	// xStride
			       sizeof (gPixels[0][0]) * width,	// yStride
			       1, 1,				// x/y sampling
			       0.0));				// fillValue

    frameBuffer.insert ("Z",					// name
			Slice (IMF::FLOAT,			// type
			       (char *) (&zPixels[0][0] -	// base
					 dw.min.x -
					 dw.min.y * width),
			       sizeof (zPixels[0][0]) * 1,	 // xStride
			       sizeof (zPixels[0][0]) * width,	// yStride
			       1, 1,				// x/y sampling
			       std::numeric_limits<float>::max()));		// fillValue

    file.setFrameBuffer (frameBuffer);
    file.readPixels (dw.min.y, dw.max.y);
}